

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.hpp
# Opt level: O1

size_t __thiscall
gmlc::containers::
BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
::size(BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
       *this)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  int iVar5;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->m_pullLock);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar5 == 0) {
    ppVar1 = (this->pushElements).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar2 = (this->pullElements).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar3 = (this->pullElements).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (this->pushElements).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_pullLock);
    return ((long)ppVar1 - (long)ppVar4 >> 6) + ((long)ppVar2 - (long)ppVar3 >> 6);
  }
  std::__throw_system_error(iVar5);
}

Assistant:

size_t BlockingQueue<T, MUTEX, COND>::size() const
    {
        std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
        std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
        return pullElements.size() + pushElements.size();
    }